

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O0

void vp9_unref_frame(VP9Context *s,VP9Frame *f)

{
  MppBuffer local_20;
  MppBuffer framebuf;
  VP9Frame *f_local;
  VP9Context *s_local;
  
  framebuf = f;
  f_local = (VP9Frame *)s;
  if ((f->ref->ref_count < 1) || (0x7e < f->slot_index)) {
    _mpp_log_l(2,(char *)0x0,"ref count alreay is zero",(char *)0x0);
  }
  else {
    f->ref->ref_count = f->ref->ref_count + -1;
    if (f->ref->ref_count == 0) {
      if (f->slot_index < 0x80) {
        if ((f->ref->invisible != 0) && (f->ref->is_output == 0)) {
          local_20 = (MppBuffer)0x0;
          mpp_buf_slot_get_prop(s->slots,f->slot_index,SLOT_BUFFER,&local_20);
          mpp_buffer_put_with_caller(local_20,"vp9_unref_frame");
          *(undefined4 *)(*(long *)((long)framebuf + 0x10) + 4) = 0;
        }
        mpp_buf_slot_clr_flag(f_local[0x4b1].ref,*(RK_S32 *)((long)framebuf + 8),SLOT_CODEC_USE);
      }
      mpp_osal_free("vp9_unref_frame",*(void **)((long)framebuf + 0x10));
      *(undefined4 *)((long)framebuf + 8) = 0xff;
      *(undefined8 *)((long)framebuf + 0x10) = 0;
    }
    *(undefined8 *)((long)framebuf + 0x10) = 0;
  }
  return;
}

Assistant:

static void vp9_unref_frame( VP9Context *s, VP9Frame *f)
{
    if (f->ref->ref_count <= 0 || f->slot_index >= 0x7f) {
        mpp_err("ref count alreay is zero");
        return;
    }
    f->ref->ref_count--;
    if (!f->ref->ref_count) {
        if (f->slot_index <= 0x7f) {
            if (f->ref->invisible && !f->ref->is_output) {
                MppBuffer framebuf = NULL;

                mpp_buf_slot_get_prop(s->slots, f->slot_index, SLOT_BUFFER, &framebuf);
                mpp_buffer_put(framebuf);
                f->ref->invisible = 0;
            }
            mpp_buf_slot_clr_flag(s->slots, f->slot_index, SLOT_CODEC_USE);
        }
        mpp_free(f->ref);
        f->slot_index = 0xff;
        f->ref = NULL;
    }
    f->ref = NULL;
    return;
}